

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

void __thiscall pbrt::MLTSampler::EnsureReady(MLTSampler *this,int index)

{
  PrimarySample *pPVar1;
  PrimarySample *pPVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar10;
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_register_00001304 [12];
  undefined1 extraout_var [60];
  
  auVar12 = in_ZMM1._0_16_;
  auVar8 = in_ZMM0._0_16_;
  uVar7 = (ulong)index;
  if ((this->X).nStored <= uVar7) {
    pstd::
    vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
    ::resize(&this->X,(long)(index + 1));
  }
  pPVar2 = (this->X).ptr;
  lVar3 = this->lastLargeStepIteration;
  pPVar1 = pPVar2 + uVar7;
  if (pPVar2[uVar7].lastModificationIteration < lVar3) {
    uVar7 = (this->rng).state;
    (this->rng).state = uVar7 * 0x5851f42d4c957f2d + (this->rng).inc;
    uVar6 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
    bVar5 = (byte)(uVar7 >> 0x3b);
    auVar8 = vcvtusi2ss_avx512f(auVar8,uVar6 >> bVar5 | uVar6 << 0x20 - bVar5);
    auVar8 = vminss_avx(ZEXT416((uint)(auVar8._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    pPVar1->value = auVar8._0_4_;
    pPVar1->lastModificationIteration = lVar3;
  }
  pPVar1->valueBackup = pPVar1->value;
  lVar3 = pPVar1->lastModificationIteration;
  pPVar1->modifyBackup = lVar3;
  if (this->largeStep == true) {
    uVar7 = (this->rng).state;
    (this->rng).state = uVar7 * 0x5851f42d4c957f2d + (this->rng).inc;
    uVar6 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
    bVar5 = (byte)(uVar7 >> 0x3b);
    auVar8 = vcvtusi2ss_avx512f(auVar12,uVar6 >> bVar5 | uVar6 << 0x20 - bVar5);
    auVar8 = vminss_avx(ZEXT416((uint)(auVar8._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    fVar9 = auVar8._0_4_;
  }
  else {
    uVar7 = (this->rng).state;
    lVar4 = this->currentIteration;
    (this->rng).state = uVar7 * 0x5851f42d4c957f2d + (this->rng).inc;
    uVar6 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
    bVar5 = (byte)(uVar7 >> 0x3b);
    auVar8 = vcvtusi2ss_avx512f(auVar12,uVar6 >> bVar5 | uVar6 << 0x20 - bVar5);
    auVar8 = vminss_avx(ZEXT416((uint)(auVar8._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar8,ZEXT416(0xbf800000));
    auVar8 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar12,auVar12);
    auVar8 = vmaxss_avx(SUB6416(ZEXT464(0x800000),0),auVar8);
    auVar13._0_4_ = logf(auVar8._0_4_);
    auVar13._4_60_ = extraout_var;
    if (0x7f7fffff < (uint)ABS(auVar13._0_4_)) {
      LogFatal<char_const(&)[28]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.h"
                 ,0x2e5,"Check failed: %s",(char (*) [28])"!IsNaN(t) && !std::isinf(t)");
    }
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar11 = auVar13._0_16_;
    auVar8 = vandps_avx512vl(auVar11,auVar8);
    if (auVar8._0_4_ <= 6.125) {
      auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x31bae000),0),auVar11,ZEXT416(0x3419da2c));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x35a4c94e));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x33f295dd));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0xb86b8609));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0xb91adf4d));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x3b17b201));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x3c3d0f26));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0xbe6d9577));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x3f62dfc4));
      fVar9 = auVar8._0_4_;
    }
    else {
      auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x2fa6f5a2),0),auVar11,ZEXT416(0x32fbe4d7));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x35a3f289));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x37ee53ef));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x39ce55c9));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x3b46606f));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x3b9e5490));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0xbe877fb3));
      auVar8 = vfmadd213ss_fma(auVar8,auVar11,ZEXT416(0x3f570b52));
      fVar9 = auVar8._0_4_;
    }
    auVar8 = vfmadd132ss_fma(ZEXT416((uint)(fVar9 * auVar12._0_4_)),ZEXT816(0) << 0x20,
                             ZEXT416(0x3fb504f3));
    fVar9 = this->sigma;
    auVar12._0_4_ = (float)(lVar4 - lVar3);
    auVar12._4_12_ = in_register_00001304;
    if (auVar12._0_4_ < 0.0) {
      fVar10 = sqrtf(auVar12._0_4_);
      auVar8 = ZEXT416(auVar8._0_4_);
    }
    else {
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      fVar10 = auVar12._0_4_;
    }
    auVar12 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 * fVar10)),auVar8,ZEXT416((uint)pPVar1->value));
    pPVar1->value = auVar12._0_4_;
    auVar8 = vroundss_avx(auVar12,auVar12,9);
    fVar9 = auVar12._0_4_ - auVar8._0_4_;
  }
  pPVar1->value = fVar9;
  pPVar1->lastModificationIteration = this->currentIteration;
  return;
}

Assistant:

void MLTSampler::EnsureReady(int index) {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("MLTSampler not supported on GPU--needs vector resize...");
    return;
#else
    // Enlarge _MLTSampler::X_ if necessary and get current $\VEC{X}_i$
    if (index >= X.size())
        X.resize(index + 1);
    PrimarySample &Xi = X[index];

    // Reset $\VEC{X}_i$ if a large step took place in the meantime
    if (Xi.lastModificationIteration < lastLargeStepIteration) {
        Xi.value = rng.Uniform<Float>();
        Xi.lastModificationIteration = lastLargeStepIteration;
    }

    // Apply remaining sequence of mutations to _sample_
    Xi.Backup();
    if (largeStep) {
        Xi.value = rng.Uniform<Float>();
    } else {
        int64_t nSmall = currentIteration - Xi.lastModificationIteration;
        // Apply _nSmall_ small step mutations
        // Sample the standard normal distribution $N(0, 1)$
        Float normalSample = SampleNormal(rng.Uniform<Float>());

        // Compute the effective standard deviation and apply perturbation to $\VEC{X}_i$
        Float effSigma = sigma * std::sqrt((Float)nSmall);
        Xi.value += normalSample * effSigma;
        Xi.value -= std::floor(Xi.value);
    }
    Xi.lastModificationIteration = currentIteration;

#endif
}